

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::EmptyConstraintPS::execute
          (EmptyConstraintPS *this,VectorBase<double> *param_2,VectorBase<double> *y,
          VectorBase<double> *s,VectorBase<double> *param_5,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  double dVar1;
  VarStatus VVar2;
  double *pdVar3;
  VarStatus *pVVar4;
  long in_RDI;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_00000008;
  int in_stack_ffffffffffffff9c;
  VectorBase<double> *in_stack_ffffffffffffffa0;
  VectorBase<double> *this_00;
  
  if (*(int *)(in_RDI + 0x28) != *(int *)(in_RDI + 0x2c)) {
    pdVar3 = VectorBase<double>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    dVar1 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    *pdVar3 = dVar1;
    pdVar3 = VectorBase<double>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    dVar1 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    *pdVar3 = dVar1;
    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (in_stack_00000008,*(int *)(in_RDI + 0x28));
    VVar2 = *pVVar4;
    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (in_stack_00000008,*(int *)(in_RDI + 0x2c));
    *pVVar4 = VVar2;
  }
  pdVar3 = VectorBase<double>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  *pdVar3 = 0.0;
  this_00 = *(VectorBase<double> **)(in_RDI + 0x30);
  pdVar3 = VectorBase<double>::operator[](this_00,in_stack_ffffffffffffff9c);
  *pdVar3 = (double)this_00;
  pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                     (in_stack_00000008,*(int *)(in_RDI + 0x28));
  *pVVar4 = BASIC;
  return;
}

Assistant:

void SPxMainSM<R>::EmptyConstraintPS::execute(VectorBase<R>&, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>&,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // primal:
   s[m_i] = 0.0;

   // dual:
   y[m_i] = m_row_obj;

   // basis:
   rStatus[m_i] = SPxSolverBase<R>::BASIC;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM16 Dimension doesn't match after this step.");
   }

#endif
}